

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_draw(void)

{
  uint uVar1;
  rf_vertex_buffer *prVar2;
  _func_void_uint_uint *p_Var3;
  rf_draw_call *prVar4;
  rf_vertex_buffer *prVar5;
  float fVar6;
  float fVar7;
  rf_context *prVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  rf_render_batch *prVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  rf_mat mat_model_view;
  rf_mat mat_projection;
  rf_mat mat_mvp;
  rf_float16 buffer;
  
  prVar39 = (rf__ctx->field_0).current_batch;
  prVar2 = prVar39->vertex_buffers;
  lVar41 = prVar39->current_buffer;
  if (0 < prVar2[lVar41].v_counter) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(prVar2[lVar41].vao_id);
    prVar39 = (rf__ctx->field_0).current_batch;
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,prVar39->vertex_buffers[prVar39->current_buffer].vbo_id[0]);
    prVar39 = (rf__ctx->field_0).current_batch;
    lVar41 = prVar39->current_buffer;
    prVar2 = prVar39->vertex_buffers;
    iVar40 = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)prVar2[lVar41].v_counter * 0xc,prVar2[lVar41].vertices);
    prVar39 = (rf__ctx->field_0).current_batch;
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,prVar39->vertex_buffers[prVar39->current_buffer].vbo_id[1]);
    prVar39 = (rf__ctx->field_0).current_batch;
    lVar41 = prVar39->current_buffer;
    prVar2 = prVar39->vertex_buffers;
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)prVar2[lVar41].v_counter << 3,prVar2[lVar41].texcoords);
    prVar39 = (rf__ctx->field_0).current_batch;
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,prVar39->vertex_buffers[prVar39->current_buffer].vbo_id[2]);
    prVar39 = (rf__ctx->field_0).current_batch;
    lVar41 = prVar39->current_buffer;
    prVar2 = prVar39->vertex_buffers;
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)prVar2[lVar41].v_counter << 2,prVar2[lVar41].colors);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
    fVar19 = (rf__ctx->field_0).projection.m0;
    fVar20 = (rf__ctx->field_0).projection.m4;
    fVar21 = (rf__ctx->field_0).projection.m8;
    fVar22 = (rf__ctx->field_0).projection.m12;
    fVar15 = (rf__ctx->field_0).projection.m1;
    fVar16 = (rf__ctx->field_0).projection.m5;
    fVar17 = (rf__ctx->field_0).projection.m9;
    fVar18 = (rf__ctx->field_0).projection.m13;
    fVar11 = (rf__ctx->field_0).projection.m2;
    fVar12 = (rf__ctx->field_0).projection.m6;
    fVar13 = (rf__ctx->field_0).projection.m10;
    fVar14 = (rf__ctx->field_0).projection.m14;
    fVar6 = (rf__ctx->field_0).projection.m3;
    fVar7 = (rf__ctx->field_0).projection.m7;
    fVar9 = (rf__ctx->field_0).projection.m11;
    fVar10 = (rf__ctx->field_0).projection.m15;
    fVar35 = (rf__ctx->field_0).modelview.m0;
    fVar36 = (rf__ctx->field_0).modelview.m4;
    fVar37 = (rf__ctx->field_0).modelview.m8;
    fVar38 = (rf__ctx->field_0).modelview.m12;
    fVar31 = (rf__ctx->field_0).modelview.m1;
    fVar32 = (rf__ctx->field_0).modelview.m5;
    fVar33 = (rf__ctx->field_0).modelview.m9;
    fVar34 = (rf__ctx->field_0).modelview.m13;
    fVar27 = (rf__ctx->field_0).modelview.m2;
    fVar28 = (rf__ctx->field_0).modelview.m6;
    fVar29 = (rf__ctx->field_0).modelview.m10;
    fVar30 = (rf__ctx->field_0).modelview.m14;
    fVar23 = (rf__ctx->field_0).modelview.m3;
    fVar24 = (rf__ctx->field_0).modelview.m7;
    fVar25 = (rf__ctx->field_0).modelview.m11;
    fVar26 = (rf__ctx->field_0).modelview.m15;
    prVar39 = (rf__ctx->field_0).current_batch;
    if (0 < prVar39->vertex_buffers[prVar39->current_buffer].v_counter) {
      (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)((rf__ctx->field_0).current_shader.id);
      prVar8 = rf__ctx;
      rf_mat_mul((rf__ctx->field_0).modelview,(rf__ctx->field_0).projection);
      (*(prVar8->field_0).gfx_ctx.gl.UniformMatrix4fv)
                ((prVar8->field_0).current_shader.locs[6],1,'\0',buffer.v);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
                ((rf__ctx->field_0).current_shader.locs[0xb],1.0,1.0,1.0,1.0);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1i)((rf__ctx->field_0).current_shader.locs[0xe],0);
      prVar39 = (rf__ctx->field_0).current_batch;
      (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)
                (prVar39->vertex_buffers[prVar39->current_buffer].vao_id);
      (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(0x84c0);
      prVar39 = (rf__ctx->field_0).current_batch;
      lVar42 = 0;
      for (lVar41 = 0; p_Var3 = (rf__ctx->field_0).gfx_ctx.gl.BindTexture,
          lVar41 < prVar39->draw_calls_counter; lVar41 = lVar41 + 1) {
        (*p_Var3)(0xde1,*(uint *)((long)&prVar39->draw_calls->texture_id + lVar42));
        prVar4 = ((rf__ctx->field_0).current_batch)->draw_calls;
        uVar1 = *(uint *)((long)&prVar4->mode + lVar42);
        if ((uVar1 == 4) || (uVar1 == 1)) {
          (*(rf__ctx->field_0).gfx_ctx.gl.DrawArrays)
                    (uVar1,iVar40,*(int *)((long)&prVar4->vertex_count + lVar42));
        }
        else {
          (*(rf__ctx->field_0).gfx_ctx.gl.DrawElements)
                    (4,(*(int *)((long)&prVar4->vertex_count + lVar42) / 4) * 6,0x1405,
                     (void *)(((long)iVar40 & 0x3fffffffffffffffU) * 6));
        }
        prVar39 = (rf__ctx->field_0).current_batch;
        iVar40 = iVar40 + *(int *)((long)&prVar39->draw_calls->vertex_count + lVar42) +
                 *(int *)((long)&prVar39->draw_calls->vertex_alignment + lVar42);
        lVar42 = lVar42 + 0x10;
      }
      (*p_Var3)(0xde1,0);
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
    (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(0);
    prVar8 = rf__ctx;
    prVar39 = (rf__ctx->field_0).current_batch;
    lVar41 = prVar39->current_buffer;
    prVar2 = prVar39->vertex_buffers;
    prVar5 = prVar2 + lVar41;
    prVar5->v_counter = 0;
    prVar5->tc_counter = 0;
    prVar2[lVar41].c_counter = 0;
    prVar39->current_depth = -1.0;
    (prVar8->field_0).projection.m3 = fVar6;
    (prVar8->field_0).projection.m7 = fVar7;
    (prVar8->field_0).projection.m11 = fVar9;
    (prVar8->field_0).projection.m15 = fVar10;
    (prVar8->field_0).projection.m2 = fVar11;
    (prVar8->field_0).projection.m6 = fVar12;
    (prVar8->field_0).projection.m10 = fVar13;
    (prVar8->field_0).projection.m14 = fVar14;
    (prVar8->field_0).projection.m1 = fVar15;
    (prVar8->field_0).projection.m5 = fVar16;
    (prVar8->field_0).projection.m9 = fVar17;
    (prVar8->field_0).projection.m13 = fVar18;
    (prVar8->field_0).projection.m0 = fVar19;
    (prVar8->field_0).projection.m4 = fVar20;
    (prVar8->field_0).projection.m8 = fVar21;
    (prVar8->field_0).projection.m12 = fVar22;
    (prVar8->field_0).modelview.m3 = fVar23;
    (prVar8->field_0).modelview.m7 = fVar24;
    (prVar8->field_0).modelview.m11 = fVar25;
    (prVar8->field_0).modelview.m15 = fVar26;
    (prVar8->field_0).modelview.m2 = fVar27;
    (prVar8->field_0).modelview.m6 = fVar28;
    (prVar8->field_0).modelview.m10 = fVar29;
    (prVar8->field_0).modelview.m14 = fVar30;
    (prVar8->field_0).modelview.m1 = fVar31;
    (prVar8->field_0).modelview.m5 = fVar32;
    (prVar8->field_0).modelview.m9 = fVar33;
    (prVar8->field_0).modelview.m13 = fVar34;
    (prVar8->field_0).modelview.m0 = fVar35;
    (prVar8->field_0).modelview.m4 = fVar36;
    (prVar8->field_0).modelview.m8 = fVar37;
    (prVar8->field_0).modelview.m12 = fVar38;
    prVar4 = prVar39->draw_calls;
    uVar1 = (prVar8->field_0).default_texture_id;
    for (lVar41 = 0; lVar41 != 0x1000; lVar41 = lVar41 + 0x10) {
      *(undefined8 *)((long)&prVar4->mode + lVar41) = 7;
      *(uint *)((long)&prVar4->texture_id + lVar41) = uVar1;
    }
    prVar39->draw_calls_counter = 1;
    lVar41 = -1;
    if (prVar39->current_buffer < -1) {
      lVar41 = prVar39->current_buffer;
    }
    prVar39->current_buffer = lVar41 + 1;
  }
  return;
}

Assistant:

RF_API void rf_gfx_draw()
{
    // Only process data if we have data to process
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter > 0)
    {
        // Update default internal buffers (VAOs/VBOs) with vertex array data
        // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertex_count > 0)
        // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
        {
            // Update vertex buffers data
            // Activate elements VAO
            rf_gl.BindVertexArray(rf_batch.vertex_buffers[rf_batch.current_buffer].vao_id);

            // Vertex positions buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[0]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(float) * 3 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].vertices);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 3 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

            // rf_texture coordinates buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[1]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(float) * 2 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 2 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

            // Colors buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[2]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(unsigned char) * 4 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].colors);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 4 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

            // NOTE: glMap_buffer() causes sync issue.
            // If GPU is working with this buffer, glMap_buffer() will wait(stall) until GPU to finish its job.
            // To avoid waiting (idle), you can call first rf_gl.BufferData() with NULL pointer before glMap_buffer().
            // If you do that, the previous data in PBO will be discarded and glMap_buffer() returns a new
            // allocated pointer immediately even if GPU is still working with the previous data.

            // Another option: map the buffer object into client's memory
            // Probably this code could be moved somewhere else...
            // rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices = (float* )glMap_buffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
            // if (rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices)
            // {
            // Update vertex data
            // }
            // glUnmap_buffer(GL_ARRAY_BUFFER);

            // Unbind the current VAO
            rf_gl.BindVertexArray(0);
        }

        // NOTE: Stereo rendering is checked inside
        //rf_draw_buffers_default();
        {
            // Draw default internal buffers vertex data
            rf_mat mat_projection = rf_ctx.projection;
            rf_mat mat_model_view = rf_ctx.modelview;

            // Draw buffers
            if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter > 0)
            {
                // Set current shader and upload current MVP matrix
                rf_gl.UseProgram(rf_ctx.current_shader.id);

                // Create rf_ctx->gl_ctx.modelview-rf_ctx->gl_ctx.projection matrix
                rf_mat mat_mvp = rf_mat_mul(rf_ctx.modelview, rf_ctx.projection);

                rf_gl.UniformMatrix4fv(rf_ctx.current_shader.locs[RF_LOC_MATRIX_MVP], 1, false, rf_mat_to_float16(mat_mvp).v);
                rf_gl.Uniform4f(rf_ctx.current_shader.locs[RF_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
                rf_gl.Uniform1i(rf_ctx.current_shader.locs[RF_LOC_MAP_DIFFUSE], 0);    // Provided value refers to the texture unit (active)

                // TODO: Support additional texture units on custom shader
                //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) rf_gl.Uniform1i(rf_ctx->gl_ctx.current_shader.locs[RF_LOC_MAP_SPECULAR], 1);
                //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_NORMAL] > 0) rf_gl.Uniform1i(rf_ctx->gl_ctx.current_shader.locs[RF_LOC_MAP_NORMAL], 2);

                // NOTE: Right now additional map textures not considered for default buffers drawing

                int vertex_offset = 0;

                rf_gl.BindVertexArray(rf_batch.vertex_buffers[rf_batch.current_buffer].vao_id);

                rf_gl.ActiveTexture(GL_TEXTURE0);

                for (rf_int i = 0; i < rf_batch.draw_calls_counter; i++)
                {
                    rf_gl.BindTexture(GL_TEXTURE_2D, rf_batch.draw_calls[i].texture_id);

                    // TODO: Find some way to bind additional textures --> Use global texture IDs? Register them on draw[i]?
                    //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) { rf_gl.ActiveTexture(GL_TEXTURE1); rf_gl.BindTexture(GL_TEXTURE_2D, textureUnit1_id); }
                    //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) { rf_gl.ActiveTexture(GL_TEXTURE2); rf_gl.BindTexture(GL_TEXTURE_2D, textureUnit2_id); }

                    if ((rf_batch.draw_calls[i].mode == RF_LINES) || (rf_batch.draw_calls[i].mode == RF_TRIANGLES))
                    {
                        rf_gl.DrawArrays(rf_batch.draw_calls[i].mode, vertex_offset, rf_batch.draw_calls[i].vertex_count);
                    }
                    else
                    {
                        #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                        // We need to define the number of indices to be processed: quadsCount*6
                        // NOTE: The final parameter tells the GPU the offset in bytes from the
                        // start of the index buffer to the location of the first index to process
                        rf_gl.DrawElements(GL_TRIANGLES, rf_batch.draw_calls[i].vertex_count / 4 * 6, GL_UNSIGNED_INT, (void*)(sizeof(unsigned int) * vertex_offset / 4 * 6));
                        #elif defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
                        rf_gl.DrawElements(GL_TRIANGLES, rf_batch.draw_calls[i].vertex_count / 4 * 6, GL_UNSIGNED_SHORT, (void*)(sizeof(unsigned short) * vertex_offset / 4 * 6));
                        #endif
                    }

                    vertex_offset += (rf_batch.draw_calls[i].vertex_count + rf_batch.draw_calls[i].vertex_alignment);
                }

                rf_gl.BindTexture(GL_TEXTURE_2D, 0);
            }

            rf_gl.BindVertexArray(0);
            rf_gl.UseProgram(0);

            // Reset vertex counters for next frame
            rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter  = 0;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter = 0;
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter  = 0;

            // Reset depth for next draw
            rf_batch.current_depth = -1.0f;

            // Restore rf_ctx->gl_ctx.projection/rf_ctx->gl_ctx.modelview matrices
            rf_ctx.projection = mat_projection;
            rf_ctx.modelview  = mat_model_view;

            // Reset rf_ctx->gl_ctx.draws array
            for (rf_int i = 0; i < RF_DEFAULT_BATCH_DRAW_CALLS_COUNT; i++)
            {
                rf_batch.draw_calls[i].mode = RF_QUADS;
                rf_batch.draw_calls[i].vertex_count = 0;
                rf_batch.draw_calls[i].texture_id = rf_ctx.default_texture_id;
            }

            rf_batch.draw_calls_counter = 1;

            // Change to next buffer in the list
            rf_batch.current_buffer++;
            if (rf_batch.current_buffer >= RF_DEFAULT_BATCH_VERTEX_BUFFERS_COUNT) rf_batch.current_buffer = 0;
        }
    }
}